

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getaddrinfo.c
# Opt level: O0

int uv_getaddrinfo(uv_loop_t *loop,uv_getaddrinfo_t *req,uv_getaddrinfo_cb cb,char *hostname,
                  char *service,addrinfo *hints)

{
  size_t sVar1;
  uv_loop_t *__n;
  long lVar2;
  uv__work *__dest;
  char *in_RCX;
  void *in_RDX;
  uv_req_t *in_RSI;
  uv_loop_t *in_RDI;
  char *in_R8;
  void *in_R9;
  char *buf;
  size_t len;
  size_t hints_len;
  size_t service_len;
  size_t hostname_len;
  _func_void_uv__work_ptr_int *in_stack_ffffffffffffff78;
  _func_void_uv__work_ptr *in_stack_ffffffffffffff80;
  uv__work *in_stack_ffffffffffffff88;
  uv_loop_t *loop_00;
  size_t local_68;
  long local_58;
  int local_4;
  
  if (((in_RSI == (uv_req_t *)0x0) || (in_RDX == (void *)0x0)) ||
     ((in_RCX == (char *)0x0 && (in_R8 == (char *)0x0)))) {
    local_4 = -0x16;
  }
  else {
    if (in_RCX == (char *)0x0) {
      local_68 = 0;
    }
    else {
      local_68 = strlen(in_RCX);
      local_68 = local_68 + 1;
    }
    if (in_R8 == (char *)0x0) {
      __n = (uv_loop_t *)0x0;
    }
    else {
      sVar1 = strlen(in_R8);
      __n = (uv_loop_t *)(sVar1 + 1);
    }
    lVar2 = 0;
    if (in_R9 != (void *)0x0) {
      lVar2 = 0x30;
    }
    loop_00 = __n;
    __dest = (uv__work *)malloc((long)__n->handle_queue + lVar2 + local_68 + -0x10);
    if (__dest == (uv__work *)0x0) {
      local_4 = -0xc;
    }
    else {
      uv__req_init(in_RDI,in_RSI,UV_GETADDRINFO);
      in_RSI[1].data = in_RDI;
      in_RSI[2].active_queue[0] = in_RDX;
      in_RSI[3].active_queue[0] = (void *)0x0;
      in_RSI[2].active_queue[1] = (void *)0x0;
      *(undefined8 *)&in_RSI[3].type = 0;
      in_RSI[3].data = (void *)0x0;
      *(undefined4 *)(in_RSI[3].active_queue + 1) = 0;
      local_58 = 0;
      if (in_R9 != (void *)0x0) {
        in_stack_ffffffffffffff88 = __dest;
        memcpy(__dest,in_R9,0x30);
        in_RSI[2].active_queue[1] = in_stack_ffffffffffffff88;
        local_58 = 0x30;
      }
      if (in_R8 != (char *)0x0) {
        in_stack_ffffffffffffff80 = (_func_void_uv__work_ptr *)((long)__dest->wq + local_58 + -0x18)
        ;
        memcpy(in_stack_ffffffffffffff80,in_R8,(size_t)__n);
        *(_func_void_uv__work_ptr **)&in_RSI[3].type = in_stack_ffffffffffffff80;
        local_58 = (long)__n->handle_queue + local_58 + -0x10;
      }
      if (in_RCX != (char *)0x0) {
        in_stack_ffffffffffffff78 =
             (_func_void_uv__work_ptr_int *)((long)__dest->wq + local_58 + -0x18);
        memcpy(in_stack_ffffffffffffff78,in_RCX,local_68);
        in_RSI[3].data = in_stack_ffffffffffffff78;
      }
      uv__work_submit(loop_00,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                      in_stack_ffffffffffffff78);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int uv_getaddrinfo(uv_loop_t* loop,
                   uv_getaddrinfo_t* req,
                   uv_getaddrinfo_cb cb,
                   const char* hostname,
                   const char* service,
                   const struct addrinfo* hints) {
  size_t hostname_len;
  size_t service_len;
  size_t hints_len;
  size_t len;
  char* buf;

  if (req == NULL || cb == NULL || (hostname == NULL && service == NULL))
    return -EINVAL;

  hostname_len = hostname ? strlen(hostname) + 1 : 0;
  service_len = service ? strlen(service) + 1 : 0;
  hints_len = hints ? sizeof(*hints) : 0;
  buf = malloc(hostname_len + service_len + hints_len);

  if (buf == NULL)
    return -ENOMEM;

  uv__req_init(loop, req, UV_GETADDRINFO);
  req->loop = loop;
  req->cb = cb;
  req->res = NULL;
  req->hints = NULL;
  req->service = NULL;
  req->hostname = NULL;
  req->retcode = 0;

  /* order matters, see uv_getaddrinfo_done() */
  len = 0;

  if (hints) {
    req->hints = memcpy(buf + len, hints, sizeof(*hints));
    len += sizeof(*hints);
  }

  if (service) {
    req->service = memcpy(buf + len, service, service_len);
    len += service_len;
  }

  if (hostname) {
    req->hostname = memcpy(buf + len, hostname, hostname_len);
    len += hostname_len;
  }

  uv__work_submit(loop,
                  &req->work_req,
                  uv__getaddrinfo_work,
                  uv__getaddrinfo_done);

  return 0;
}